

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd.h
# Opt level: O0

int bsd_send(int fd,char *buf,int length,int msg_more)

{
  ssize_t sVar1;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  int in_EDI;
  
  sVar1 = send(in_EDI,in_RSI,(long)in_EDX,in_ECX << 0xf | 0x4000);
  return (int)sVar1;
}

Assistant:

static inline int bsd_send(LIBUS_SOCKET_DESCRIPTOR fd, const char *buf, int length, int msg_more) {

    // MSG_MORE (Linux), MSG_PARTIAL (Windows), TCP_NOPUSH (BSD)

#ifndef MSG_NOSIGNAL
#define MSG_NOSIGNAL 0
#endif

#ifdef MSG_MORE

    // for Linux we do not want signals
    return send(fd, buf, length, (msg_more * MSG_MORE) | MSG_NOSIGNAL);

#else

    // use TCP_NOPUSH

    return send(fd, buf, length, MSG_NOSIGNAL);

#endif
}